

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O3

bool __thiscall FIntermissionActionWiper::ParseKey(FIntermissionActionWiper *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined **ppuVar4;
  char **ppcVar5;
  WipeType FT [5];
  char *pcStack_68;
  gamestate_t agStack_60 [20];
  
  ppuVar4 = &PTR_anon_var_dwarf_c7d1d_006ec900;
  ppcVar5 = &pcStack_68;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *ppcVar5 = *ppuVar4;
    ppuVar4 = ppuVar4 + 1;
    ppcVar5 = ppcVar5 + 1;
  }
  bVar1 = FScanner::Compare(sc,"WipeType");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,&pcStack_68,0x10);
    if (iVar2 != -1) {
      this->mWipeType = agStack_60[(long)iVar2 * 4];
    }
    return true;
  }
  bVar1 = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
  return bVar1;
}

Assistant:

bool FIntermissionActionWiper::ParseKey(FScanner &sc)
{
	struct WipeType
	{
		const char *Name;
		gamestate_t Type;
	}
	const FT[] = {
		{ "Crossfade", GS_FORCEWIPEFADE },
		{ "Melt", GS_FORCEWIPEMELT },
		{ "Burn", GS_FORCEWIPEBURN },
		{ "Default", GS_FORCEWIPE },
		{ NULL, GS_FORCEWIPE }
	};

	if (sc.Compare("WipeType"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&FT[0].Name, sizeof(FT[0]));
		if (v != -1) mWipeType = FT[v].Type;
		return true;
	}
	else return Super::ParseKey(sc);
}